

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_mftr(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx,int rt,int rd,int u,int sel,
             int h)

{
  uint uVar1;
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_ptr arg1;
  TCGv_i64 retval;
  TCGv_i64 arg2;
  TCGv_i32 pTVar2;
  TCGv_i32 helper_tmp_13;
  TCGv_i32 fp0_1;
  TCGv_i32 fp0;
  TCGv_i32 helper_tmp_12;
  TCGv_i32 helper_tmp_11;
  TCGv_i32 helper_tmp_10;
  TCGv_i32 helper_tmp_9;
  TCGv_i32 helper_tmp_8;
  TCGv_i32 helper_tmp_7;
  TCGv_i32 helper_tmp_6;
  TCGv_i32 helper_tmp_5;
  TCGv_i32 helper_tmp_4;
  TCGv_i32 helper_tmp_3;
  TCGv_i32 helper_tmp_2;
  TCGv_i32 helper_tmp_1;
  TCGv_i32 helper_tmp;
  TCGv_i64 t0;
  int other_tc;
  TCGContext_conflict6 *tcg_ctx;
  int sel_local;
  int u_local;
  int rd_local;
  int rt_local;
  DisasContext_conflict6 *ctx_local;
  CPUMIPSState_conflict8 *env_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = env->CP0_VPEControl;
  retval = tcg_temp_local_new_i64(tcg_ctx_00);
  if (((env->CP0_VPEConf0 & 2U) == 0) &&
     ((env->tcs[(int)(uVar1 & 0xff)].CP0_TCBind & 0xfU) != ((env->active_tc).CP0_TCBind & 0xfU))) {
    tcg_gen_movi_i64_mips64el(tcg_ctx_00,retval,-1);
  }
  else if ((env->mvp->CP0_MVPConf0 & 0xffU) < (env->CP0_VPEControl & 0xffU)) {
    tcg_gen_movi_i64_mips64el(tcg_ctx_00,retval,-1);
  }
  else if (u == 0) {
    switch(rt) {
    case 1:
      if (sel == 1) {
        gen_helper_mftc0_vpecontrol(tcg_ctx_00,retval,tcg_ctx_00->cpu_env);
      }
      else {
        if (sel != 2) goto switchD_00d11d77_default;
        gen_helper_mftc0_vpeconf0(tcg_ctx_00,retval,tcg_ctx_00->cpu_env);
      }
      break;
    case 2:
      switch(sel) {
      case 1:
        gen_helper_mftc0_tcstatus(tcg_ctx_00,retval,tcg_ctx_00->cpu_env);
        break;
      case 2:
        gen_helper_mftc0_tcbind(tcg_ctx_00,retval,tcg_ctx_00->cpu_env);
        break;
      case 3:
        gen_helper_mftc0_tcrestart(tcg_ctx_00,retval,tcg_ctx_00->cpu_env);
        break;
      case 4:
        gen_helper_mftc0_tchalt(tcg_ctx_00,retval,tcg_ctx_00->cpu_env);
        break;
      case 5:
        gen_helper_mftc0_tccontext(tcg_ctx_00,retval,tcg_ctx_00->cpu_env);
        break;
      case 6:
        gen_helper_mftc0_tcschedule(tcg_ctx_00,retval,tcg_ctx_00->cpu_env);
        break;
      case 7:
        gen_helper_mftc0_tcschefback(tcg_ctx_00,retval,tcg_ctx_00->cpu_env);
        break;
      default:
        gen_mfc0(ctx,retval,rt,sel);
      }
      break;
    default:
      gen_mfc0(ctx,retval,rt,sel);
      break;
    case 10:
      if (sel == 0) {
        gen_helper_mftc0_entryhi(tcg_ctx_00,retval,tcg_ctx_00->cpu_env);
      }
      else {
        gen_mfc0(ctx,retval,rt,sel);
      }
      break;
    case 0xc:
      if (sel == 0) {
        gen_helper_mftc0_status(tcg_ctx_00,retval,tcg_ctx_00->cpu_env);
      }
      else {
        gen_mfc0(ctx,retval,rt,sel);
      }
      break;
    case 0xd:
      if (sel != 0) goto switchD_00d11d77_default;
      gen_helper_mftc0_cause(tcg_ctx_00,retval,tcg_ctx_00->cpu_env);
      break;
    case 0xe:
      if (sel != 0) goto switchD_00d11d77_default;
      gen_helper_mftc0_epc(tcg_ctx_00,retval,tcg_ctx_00->cpu_env);
      break;
    case 0xf:
      if (sel != 1) goto switchD_00d11d77_default;
      gen_helper_mftc0_ebase(tcg_ctx_00,retval,tcg_ctx_00->cpu_env);
      break;
    case 0x10:
      if (7 < (uint)sel) goto switchD_00d11d77_default;
      arg1 = tcg_ctx_00->cpu_env;
      arg2 = tcg_const_i64_mips64el(tcg_ctx_00,(long)sel);
      gen_helper_mftc0_configx(tcg_ctx_00,retval,arg1,arg2);
      break;
    case 0x17:
      if (sel == 0) {
        gen_helper_mftc0_debug(tcg_ctx_00,retval,tcg_ctx_00->cpu_env);
      }
      else {
        gen_mfc0(ctx,retval,rt,sel);
      }
    }
  }
  else {
    switch(sel) {
    case 0:
      pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,rt);
      gen_helper_mftgpr(tcg_ctx_00,retval,tcg_ctx_00->cpu_env,pTVar2);
      tcg_temp_free_i32(tcg_ctx_00,pTVar2);
      break;
    case 1:
      switch(rt) {
      case 0:
        pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,0);
        gen_helper_mftlo(tcg_ctx_00,retval,tcg_ctx_00->cpu_env,pTVar2);
        tcg_temp_free_i32(tcg_ctx_00,pTVar2);
        break;
      case 1:
        pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,0);
        gen_helper_mfthi(tcg_ctx_00,retval,tcg_ctx_00->cpu_env,pTVar2);
        tcg_temp_free_i32(tcg_ctx_00,pTVar2);
        break;
      case 2:
        pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,0);
        gen_helper_mftacx(tcg_ctx_00,retval,tcg_ctx_00->cpu_env,pTVar2);
        tcg_temp_free_i32(tcg_ctx_00,pTVar2);
        break;
      default:
        goto switchD_00d11d77_default;
      case 4:
        pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,1);
        gen_helper_mftlo(tcg_ctx_00,retval,tcg_ctx_00->cpu_env,pTVar2);
        tcg_temp_free_i32(tcg_ctx_00,pTVar2);
        break;
      case 5:
        pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,1);
        gen_helper_mfthi(tcg_ctx_00,retval,tcg_ctx_00->cpu_env,pTVar2);
        tcg_temp_free_i32(tcg_ctx_00,pTVar2);
        break;
      case 6:
        pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,1);
        gen_helper_mftacx(tcg_ctx_00,retval,tcg_ctx_00->cpu_env,pTVar2);
        tcg_temp_free_i32(tcg_ctx_00,pTVar2);
        break;
      case 8:
        pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,2);
        gen_helper_mftlo(tcg_ctx_00,retval,tcg_ctx_00->cpu_env,pTVar2);
        tcg_temp_free_i32(tcg_ctx_00,pTVar2);
        break;
      case 9:
        pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,2);
        gen_helper_mfthi(tcg_ctx_00,retval,tcg_ctx_00->cpu_env,pTVar2);
        tcg_temp_free_i32(tcg_ctx_00,pTVar2);
        break;
      case 10:
        pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,2);
        gen_helper_mftacx(tcg_ctx_00,retval,tcg_ctx_00->cpu_env,pTVar2);
        tcg_temp_free_i32(tcg_ctx_00,pTVar2);
        break;
      case 0xc:
        pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,3);
        gen_helper_mftlo(tcg_ctx_00,retval,tcg_ctx_00->cpu_env,pTVar2);
        tcg_temp_free_i32(tcg_ctx_00,pTVar2);
        break;
      case 0xd:
        pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,3);
        gen_helper_mfthi(tcg_ctx_00,retval,tcg_ctx_00->cpu_env,pTVar2);
        tcg_temp_free_i32(tcg_ctx_00,pTVar2);
        break;
      case 0xe:
        pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,3);
        gen_helper_mftacx(tcg_ctx_00,retval,tcg_ctx_00->cpu_env,pTVar2);
        tcg_temp_free_i32(tcg_ctx_00,pTVar2);
        break;
      case 0x10:
        gen_helper_mftdsp(tcg_ctx_00,retval,tcg_ctx_00->cpu_env);
      }
      break;
    case 2:
      if (h == 0) {
        pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
        gen_load_fpr32(ctx,pTVar2,rt);
        tcg_gen_ext_i32_i64_mips64el(tcg_ctx_00,retval,pTVar2);
        tcg_temp_free_i32(tcg_ctx_00,pTVar2);
      }
      else {
        pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
        gen_load_fpr32h(ctx,pTVar2,rt);
        tcg_gen_ext_i32_i64_mips64el(tcg_ctx_00,retval,pTVar2);
        tcg_temp_free_i32(tcg_ctx_00,pTVar2);
      }
      break;
    case 3:
      pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,rt);
      gen_helper_cfc1(tcg_ctx_00,retval,tcg_ctx_00->cpu_env,pTVar2);
      tcg_temp_free_i32(tcg_ctx_00,pTVar2);
      break;
    case 4:
    case 5:
    default:
switchD_00d11d77_default:
      tcg_temp_free_i64(tcg_ctx_00,retval);
      generate_exception_end(ctx,0x14);
      return;
    }
  }
  gen_store_gpr(tcg_ctx_00,retval,rd);
  tcg_temp_free_i64(tcg_ctx_00,retval);
  return;
}

Assistant:

static void gen_mftr(CPUMIPSState *env, DisasContext *ctx, int rt, int rd,
                     int u, int sel, int h)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int other_tc = env->CP0_VPEControl & (0xff << CP0VPECo_TargTC);
    TCGv t0 = tcg_temp_local_new(tcg_ctx);

    if ((env->CP0_VPEConf0 & (1 << CP0VPEC0_MVP)) == 0 &&
        ((env->tcs[other_tc].CP0_TCBind & (0xf << CP0TCBd_CurVPE)) !=
         (env->active_tc.CP0_TCBind & (0xf << CP0TCBd_CurVPE)))) {
        tcg_gen_movi_tl(tcg_ctx, t0, -1);
    } else if ((env->CP0_VPEControl & (0xff << CP0VPECo_TargTC)) >
               (env->mvp->CP0_MVPConf0 & (0xff << CP0MVPC0_PTC))) {
        tcg_gen_movi_tl(tcg_ctx, t0, -1);
    } else if (u == 0) {
        switch (rt) {
        case 1:
            switch (sel) {
            case 1:
                gen_helper_mftc0_vpecontrol(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            case 2:
                gen_helper_mftc0_vpeconf0(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            default:
                goto die;
                break;
            }
            break;
        case 2:
            switch (sel) {
            case 1:
                gen_helper_mftc0_tcstatus(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            case 2:
                gen_helper_mftc0_tcbind(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            case 3:
                gen_helper_mftc0_tcrestart(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            case 4:
                gen_helper_mftc0_tchalt(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            case 5:
                gen_helper_mftc0_tccontext(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            case 6:
                gen_helper_mftc0_tcschedule(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            case 7:
                gen_helper_mftc0_tcschefback(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            default:
                gen_mfc0(ctx, t0, rt, sel);
                break;
            }
            break;
        case 10:
            switch (sel) {
            case 0:
                gen_helper_mftc0_entryhi(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            default:
                gen_mfc0(ctx, t0, rt, sel);
                break;
            }
            break;
        case 12:
            switch (sel) {
            case 0:
                gen_helper_mftc0_status(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            default:
                gen_mfc0(ctx, t0, rt, sel);
                break;
            }
            break;
        case 13:
            switch (sel) {
            case 0:
                gen_helper_mftc0_cause(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            default:
                goto die;
                break;
            }
            break;
        case 14:
            switch (sel) {
            case 0:
                gen_helper_mftc0_epc(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            default:
                goto die;
                break;
            }
            break;
        case 15:
            switch (sel) {
            case 1:
                gen_helper_mftc0_ebase(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            default:
                goto die;
                break;
            }
            break;
        case 16:
            switch (sel) {
            case 0:
            case 1:
            case 2:
            case 3:
            case 4:
            case 5:
            case 6:
            case 7:
                gen_helper_mftc0_configx(tcg_ctx, t0, tcg_ctx->cpu_env, tcg_const_tl(tcg_ctx, sel));
                break;
            default:
                goto die;
                break;
            }
            break;
        case 23:
            switch (sel) {
            case 0:
                gen_helper_mftc0_debug(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            default:
                gen_mfc0(ctx, t0, rt, sel);
                break;
            }
            break;
        default:
            gen_mfc0(ctx, t0, rt, sel);
        }
    } else {
        switch (sel) {
        /* GPR registers. */
        case 0:
            gen_helper_1e0i(mftgpr, t0, rt);
            break;
        /* Auxiliary CPU registers */
        case 1:
            switch (rt) {
            case 0:
                gen_helper_1e0i(mftlo, t0, 0);
                break;
            case 1:
                gen_helper_1e0i(mfthi, t0, 0);
                break;
            case 2:
                gen_helper_1e0i(mftacx, t0, 0);
                break;
            case 4:
                gen_helper_1e0i(mftlo, t0, 1);
                break;
            case 5:
                gen_helper_1e0i(mfthi, t0, 1);
                break;
            case 6:
                gen_helper_1e0i(mftacx, t0, 1);
                break;
            case 8:
                gen_helper_1e0i(mftlo, t0, 2);
                break;
            case 9:
                gen_helper_1e0i(mfthi, t0, 2);
                break;
            case 10:
                gen_helper_1e0i(mftacx, t0, 2);
                break;
            case 12:
                gen_helper_1e0i(mftlo, t0, 3);
                break;
            case 13:
                gen_helper_1e0i(mfthi, t0, 3);
                break;
            case 14:
                gen_helper_1e0i(mftacx, t0, 3);
                break;
            case 16:
                gen_helper_mftdsp(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            default:
                goto die;
            }
            break;
        /* Floating point (COP1). */
        case 2:
            /* XXX: For now we support only a single FPU context. */
            if (h == 0) {
                TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);

                gen_load_fpr32(ctx, fp0, rt);
                tcg_gen_ext_i32_tl(tcg_ctx, t0, fp0);
                tcg_temp_free_i32(tcg_ctx, fp0);
            } else {
                TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);

                gen_load_fpr32h(ctx, fp0, rt);
                tcg_gen_ext_i32_tl(tcg_ctx, t0, fp0);
                tcg_temp_free_i32(tcg_ctx, fp0);
            }
            break;
        case 3:
            /* XXX: For now we support only a single FPU context. */
            gen_helper_1e0i(cfc1, t0, rt);
            break;
        /* COP2: Not implemented. */
        case 4:
        case 5:
            /* fall through */
        default:
            goto die;
        }
    }
    gen_store_gpr(tcg_ctx, t0, rd);
    tcg_temp_free(tcg_ctx, t0);
    return;

die:
    tcg_temp_free(tcg_ctx, t0);
    LOG_DISAS("mftr (reg %d u %d sel %d h %d)\n", rt, u, sel, h);
    generate_exception_end(ctx, EXCP_RI);
}